

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

char * hash_get(void *data,char *key)

{
  int iVar1;
  char *in_RSI;
  long *in_RDI;
  linkedlist_t *map;
  long *local_20;
  
  local_20 = in_RDI;
  if (in_RSI != (char *)0x0) {
    for (; local_20 != (long *)0x0; local_20 = (long *)local_20[2]) {
      if ((*local_20 != 0) && (iVar1 = strcmp((char *)*local_20,in_RSI), iVar1 == 0)) {
        return (char *)local_20[1];
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char *hash_get(void *data, char *key) {
#ifdef DEBUG
	printf("hash_get([void *], %s)...\n", key);
#endif

	linkedlist_t *map = (linkedlist_t *) data;
	if ( key == NULL ) {
#ifdef DEBUG
		printf("hash_get([void *], %s)... DONE\n", key);
#endif
		return NULL;
	}
	while ( map != NULL ) {
		if ( map->key != NULL && !strcmp(map->key, key) ) {
			return map->value;
		}
		map = map->next;
	}
#ifdef DEBUG
	printf("hash_get([void *], %s)... DONE\n", key);
#endif
	return NULL;
}